

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::NoopNormalizer2::normalize
          (NoopNormalizer2 *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  UBool UVar1;
  UErrorCode *errorCode_local;
  UnicodeString *dest_local;
  UnicodeString *src_local;
  NoopNormalizer2 *this_local;
  
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    if (dest == src) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeString::operator=(dest,src);
    }
  }
  return dest;
}

Assistant:

virtual UnicodeString &
    normalize(const UnicodeString &src,
              UnicodeString &dest,
              UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if(&dest!=&src) {
                dest=src;
            } else {
                errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        return dest;
    }